

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerBase::PathTypeHandlerBase
          (PathTypeHandlerBase *this,TypePath *typePath,uint16 pathLength,PropertyIndex slotCapacity
          ,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,bool isLocked,bool isShared,
          DynamicType *predecessorType)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  PathTypeHandlerBase *pPVar7;
  byte bVar8;
  PathTypeHandlerBase *handler;
  undefined1 local_22;
  undefined1 local_21;
  uint16 local_20;
  uint16 local_1e;
  PropertyIndex local_1c;
  bool isShared_local;
  bool isLocked_local;
  uint16 offsetOfInlineSlots_local;
  uint16 inlineSlotCapacity_local;
  PropertyIndex slotCapacity_local;
  uint16 pathLength_local;
  TypePath *typePath_local;
  PathTypeHandlerBase *this_local;
  
  local_21 = isLocked;
  local_22 = isShared;
  bVar2 = 0;
  if (isLocked) {
    bVar2 = 4;
  }
  bVar8 = 0;
  if (isShared) {
    bVar8 = 0x18;
  }
  local_20 = offsetOfInlineSlots;
  local_1e = inlineSlotCapacity;
  local_1c = slotCapacity;
  _isShared_local = pathLength;
  _offsetOfInlineSlots_local = typePath;
  typePath_local = (TypePath *)this;
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,(uint)slotCapacity,inlineSlotCapacity,
             offsetOfInlineSlots,bVar2 | 1 | bVar8);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e48858
  ;
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->predecessorType,predecessorType);
  Memory::WriteBarrierPtr<Js::TypePath>::WriteBarrierPtr(&this->typePath,_offsetOfInlineSlots_local)
  ;
  handler = (PathTypeHandlerBase *)0x0;
  Memory::WriteBarrierPtr<Js::PathTypeSuccessorInfo>::WriteBarrierPtr(&this->successorInfo,&handler)
  ;
  this->hasUserDefinedCtor = false;
  this->hasInternalProperty = false;
  if (local_1c < _isShared_local) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xf2,"(pathLength <= slotCapacity)","pathLength <= slotCapacity");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_1c < local_1e) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xf3,"(inlineSlotCapacity <= slotCapacity)",
                                "inlineSlotCapacity <= slotCapacity");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  DynamicTypeHandler::SetUnusedBytesValue(&this->super_DynamicTypeHandler,_isShared_local);
  if (predecessorType != (DynamicType *)0x0) {
    pDVar6 = DynamicType::GetTypeHandler(predecessorType);
    iVar4 = (*pDVar6->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar4 != 0) {
      pDVar6 = DynamicType::GetTypeHandler(predecessorType);
      pPVar7 = FromTypeHandler(pDVar6);
      this->hasUserDefinedCtor = (Type)(pPVar7->hasUserDefinedCtor & 1);
      this->hasInternalProperty = (Type)(pPVar7->hasInternalProperty & 1);
    }
  }
  return;
}

Assistant:

PathTypeHandlerBase::PathTypeHandlerBase(TypePath* typePath, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType) :
        DynamicTypeHandler(slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | (isLocked ? IsLockedFlag : 0) | (isShared ? (MayBecomeSharedFlag | IsSharedFlag) : 0)),
        typePath(typePath),
        predecessorType(predecessorType),
        successorInfo(nullptr),
        hasUserDefinedCtor(false),
        hasInternalProperty(false)
    {
        Assert(pathLength <= slotCapacity);
        Assert(inlineSlotCapacity <= slotCapacity);
        SetUnusedBytesValue(pathLength);

        if (predecessorType != nullptr && predecessorType->GetTypeHandler()->IsPathTypeHandler())
        {
            auto* handler = PathTypeHandlerBase::FromTypeHandler(predecessorType->GetTypeHandler());
            hasUserDefinedCtor = handler->hasUserDefinedCtor;
            hasInternalProperty = handler->hasInternalProperty;
        }
    }